

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioAppearance.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::RadioAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,RadioAppearance *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Radio:",6);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tFrozen Status:  ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tState:          ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString RadioAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Radio:"
       << "\n\tFrozen Status:  " << m_FrozenStatus
       << "\n\tState:          " << m_State
       << "\n";

    return ss.str();
}